

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::upPartialsByPartitionAsync
          (BeagleCPUImpl<double,_1,_1> *this,int *operations,int count)

{
  int in_EDX;
  long in_RSI;
  bool *__stat_loc;
  BeagleCPUImpl<double,_1,_1> **in_RDI;
  int i_2;
  unique_lock<std::mutex> l;
  threadData *td;
  packaged_task<void_()> threadTask;
  int i_1;
  int j;
  int t;
  int i;
  int numOps;
  mutex_type *__m;
  unique_lock<std::mutex> *this_00;
  shared_future<void> *in_stack_fffffffffffffef8;
  packaged_task<void_()> *this_01;
  bool *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar1;
  packaged_task<void_()> *in_stack_ffffffffffffff20;
  BeagleOpCodes *in_stack_ffffffffffffff30;
  shared_future<void> local_b8;
  unique_lock<std::mutex> local_a8;
  undefined1 local_94 [44];
  packaged_task<void_()> local_68 [3];
  bool local_38 [16];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_18 = 9;
  __stat_loc = (bool *)0x0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  memset(in_RDI[0x2a],0,(long)*(int *)(in_RDI + 0x27) << 2);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    local_20 = *(int *)(local_10 + (long)(local_1c * local_18 + 7) * 4) % *(int *)(in_RDI + 0x27);
    for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
      __stat_loc = (bool *)(long)local_20;
      *(undefined4 *)
       ((long)(&(in_RDI[0x29]->super_BeagleImpl)._vptr_BeagleImpl)[local_20] +
       (long)(*(int *)((long)&(in_RDI[0x2a]->super_BeagleImpl)._vptr_BeagleImpl +
                      (long)__stat_loc * 4) * local_18 + local_24) * 4) =
           *(undefined4 *)(local_10 + (long)(local_1c * local_18 + local_24) * 4);
    }
    *(int *)((long)&(in_RDI[0x2a]->super_BeagleImpl)._vptr_BeagleImpl + (long)local_20 * 4) =
         *(int *)((long)&(in_RDI[0x2a]->super_BeagleImpl)._vptr_BeagleImpl + (long)local_20 * 4) + 1
    ;
  }
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x27); local_28 = local_28 + 1) {
    local_94._36_8_ = 0;
    local_94._28_8_ = 0x1a1;
    local_94[0x13] = '\x01';
    local_94._4_8_ = (&(in_RDI[0x29]->super_BeagleImpl)._vptr_BeagleImpl)[local_28];
    local_94._0_4_ = -1;
    __m = (mutex_type *)local_94;
    this_01 = local_68;
    std::
    bind<int(beagle::cpu::BeagleCPUImpl<double,1,1>::*)(bool,int_const*,int,int),beagle::cpu::BeagleCPUImpl<double,1,1>*,bool,int_const*,int&,BeagleOpCodes>
              ((offset_in_BeagleCPUImpl<double,_1,_1>_to_subr *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),in_RDI,
               in_stack_ffffffffffffff08,(int **)this_01,(int *)in_stack_fffffffffffffef8,
               in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff08 = local_38;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<int(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,bool,int_const*,int,BeagleOpCodes))(bool,int_const*,int,int)>,void>
              (in_stack_ffffffffffffff20,
               (_Bind<int_(beagle::cpu::BeagleCPUImpl<double,_1,_1>::*(beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_bool,_const_int_*,_int,_BeagleOpCodes))(bool,_const_int_*,_int,_int)>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::packaged_task<void_()>::get_future
              ((packaged_task<void_()> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    this_00 = &local_a8;
    in_stack_fffffffffffffef8 = &local_b8;
    std::shared_future<void>::shared_future((shared_future<void> *)this_00,(future<void> *)__m);
    std::shared_future<void>::operator=((shared_future<void> *)this_01,in_stack_fffffffffffffef8);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x1a31a1);
    std::future<void>::~future((future<void> *)0x1a31ab);
    in_stack_ffffffffffffff30 =
         (BeagleOpCodes *)((long)&in_RDI[0x28]->super_BeagleImpl + (long)local_28 * 0xb8);
    std::unique_lock<std::mutex>::unique_lock(this_00,__m);
    __stat_loc = local_38;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            *)this_00,(value_type *)__m);
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    std::packaged_task<void_()>::~packaged_task(this_01);
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x27); iVar1 = iVar1 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)(&in_RDI[0x2e]->super_BeagleImpl + iVar1),__stat_loc);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartialsByPartitionAsync(const int* operations,
                                                                  int count) {

    int numOps = BEAGLE_PARTITION_OP_COUNT;

    memset(gThreadOpCounts, 0, sizeof(int) * kNumThreads);

    for (int i=0; i<count; i++) {
        int t = operations[i * numOps + 7] % kNumThreads;
        for (int j=0; j<numOps; j++) {
            gThreadOperations[t][gThreadOpCounts[t]*numOps + j] = operations[i*numOps + j];
        }
        gThreadOpCounts[t]++;
    }

    for (int i=0; i<kNumThreads; i++) {
        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials, this,
                      true,
                      (const int*) gThreadOperations[i],
                      gThreadOpCounts[i],
                      BEAGLE_OP_NONE));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

    return BEAGLE_SUCCESS;
}